

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_attributes_uint16(void *a,uint16_t **attrib)

{
  trico_stream_type tVar1;
  uint uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *decompressed_b2;
  uint32_t bytes_decompressed;
  uint8_t *decompressed_b1;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  trico_archive *arch;
  uint16_t **attrib_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch = (trico_archive *)attrib;
  attrib_local = (uint16_t **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == trico_attribute_uint16_stream) {
    sVar4 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar4 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar4 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar4 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        pcVar5 = (char *)trico_malloc((ulong)(uint)compressed);
        sVar4 = read((int)pcVar5,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar4 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          b1 = (uint8_t *)trico_malloc((ulong)compressed._4_4_);
          uVar2 = LZ4_decompress_safe(pcVar5,(char *)b1,(uint)compressed,compressed._4_4_);
          if (uVar2 != compressed._4_4_) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x5bd,"int trico_read_attributes_uint16(void *, uint16_t **)");
          }
          sVar4 = read((int)&compressed,(void *)0x4,1);
          if ((int)sVar4 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            pcVar5 = (char *)trico_realloc(pcVar5,(ulong)(uint)compressed);
            sVar4 = read((int)pcVar5,(void *)0x1,(ulong)(uint)compressed);
            if ((int)sVar4 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              b2 = (uint8_t *)trico_malloc((ulong)compressed._4_4_);
              uVar3 = LZ4_decompress_safe(pcVar5,(char *)b2,(uint)compressed,compressed._4_4_);
              if (uVar3 != compressed._4_4_) {
                __assert_fail("bytes_decompressed == nr_of_attribs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x5c6,"int trico_read_attributes_uint16(void *, uint16_t **)");
              }
              if (arch != (trico_archive *)0x0) {
                trico_transpose_uint16_soa_to_aos((uint16_t **)arch,b1,b2,compressed._4_4_);
              }
              trico_free(pcVar5);
              trico_free(b1);
              trico_free(b2);
              read_next_stream_type(_nr_of_compressed_bytes);
              a_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int trico_read_attributes_uint16(void* a, uint16_t** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_uint16_stream)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint16_soa_to_aos(attrib, decompressed_b1, decompressed_b2, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);

  read_next_stream_type(arch);

  return 1;
  }